

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeParameters.cpp
# Opt level: O2

void __thiscall OpenMD::FluctuatingChargeParameters::validate(FluctuatingChargeParameters *this)

{
  int iVar1;
  pointer pcVar2;
  bool bVar3;
  allocator<char> local_b55;
  allocator<char> local_b54;
  allocator<char> local_b53;
  allocator<char> local_b52;
  allocator<char> local_b51;
  double local_b50;
  allocator<char> local_b41;
  double local_b40;
  pointer local_b38;
  EqualIgnoreCaseConstraint local_b30;
  EqualIgnoreCaseConstraint local_af0;
  EqualIgnoreCaseConstraint local_ab0;
  EqualIgnoreCaseConstraint local_a70;
  string local_a30;
  string local_a10;
  string local_9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  string local_870;
  EqualIgnoreCaseConstraint local_850;
  string local_810;
  EqualIgnoreCaseConstraint local_7f0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint> local_730;
  undefined8 local_690 [4];
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_670;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_4b0;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_290;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_190;
  
  if ((this->Propagator).super_ParameterBase.empty_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_750,"Damped",(allocator<char> *)local_690);
    isEqualIgnoreCase(&local_b30,&local_750);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_770,"NVT",&local_b51);
    isEqualIgnoreCase(&local_ab0,&local_770);
    OpenMD::operator||(&local_730,
                       &local_b30.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>,
                       &local_ab0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_790,"Langevin",&local_b52);
    isEqualIgnoreCase(&local_af0,&local_790);
    OpenMD::operator||(&local_290,
                       &local_730.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_af0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b0,"Minimizer",&local_b53);
    isEqualIgnoreCase(&local_a70,&local_7b0);
    OpenMD::operator||(&local_190,
                       &local_290.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_a70.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_810,"NVE",&local_b54);
    isEqualIgnoreCase(&local_7f0,&local_810);
    OpenMD::operator||(&local_670,
                       &local_190.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_7f0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_870,"Exact",&local_b55);
    isEqualIgnoreCase(&local_850,&local_870);
    OpenMD::operator||(&local_4b0,
                       &local_670.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_850.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string((string *)&local_890,(string *)&(this->Propagator).data_);
    bVar3 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_4b0,&local_890);
    std::__cxx11::string::~string((string *)&local_890);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_4b0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_850);
    std::__cxx11::string::~string((string *)&local_870);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_670);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_7f0);
    std::__cxx11::string::~string((string *)&local_810);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_190);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_a70);
    std::__cxx11::string::~string((string *)&local_7b0);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_290);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_af0);
    std::__cxx11::string::~string((string *)&local_790);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint(&local_730);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_ab0);
    std::__cxx11::string::~string((string *)&local_770);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_b30);
    std::__cxx11::string::~string((string *)&local_750);
    if (!bVar3) {
      pcVar2 = (this->Propagator).super_ParameterBase.keyword_._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8b0,"Damped",&local_b51);
      isEqualIgnoreCase(&local_b30,&local_8b0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d0,"NVT",&local_b52);
      isEqualIgnoreCase(&local_ab0,&local_8d0);
      OpenMD::operator||(&local_730,
                         &local_b30.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>,
                         &local_ab0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8f0,"Langevin",&local_b53)
      ;
      isEqualIgnoreCase(&local_af0,&local_8f0);
      OpenMD::operator||(&local_290,
                         &local_730.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_af0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_910,"Minimizer",&local_b54);
      isEqualIgnoreCase(&local_a70,&local_910);
      OpenMD::operator||(&local_190,
                         &local_290.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_a70.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>)
      ;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_930,"NVE",&local_b55);
      isEqualIgnoreCase(&local_7f0,&local_930);
      OpenMD::operator||(&local_670,
                         &local_190.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_7f0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>)
      ;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_950,"Exact",&local_b41);
      isEqualIgnoreCase(&local_850,&local_950);
      OpenMD::operator||(&local_4b0,
                         &local_670.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_850.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>)
      ;
      std::__cxx11::string::string((string *)local_690,(string *)&local_4b0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar2,local_690[0]);
      std::__cxx11::string::~string((string *)local_690);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_4b0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_850);
      std::__cxx11::string::~string((string *)&local_950);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_670);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_7f0);
      std::__cxx11::string::~string((string *)&local_930);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_190);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_a70);
      std::__cxx11::string::~string((string *)&local_910);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_290);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_af0);
      std::__cxx11::string::~string((string *)&local_8f0);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint(&local_730);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_ab0);
      std::__cxx11::string::~string((string *)&local_8d0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_b30);
      std::__cxx11::string::~string((string *)&local_8b0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->Friction).super_ParameterBase.empty_ == false) {
    isNonNegative();
    local_b50 = (this->Friction).data_;
    std::__cxx11::string::~string((string *)&local_4b0);
    if (local_b50 < 0.0) {
      pcVar2 = (this->Friction).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      std::__cxx11::string::string((string *)&local_4b0,(string *)&local_670);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar2,
               local_4b0.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_670);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->Tolerance).super_ParameterBase.empty_ == false) {
    isPositive();
    local_b50 = (this->Tolerance).data_;
    std::__cxx11::string::~string((string *)&local_4b0);
    if (local_b50 <= 0.0) {
      pcVar2 = (this->Tolerance).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&local_4b0,(string *)&local_670);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar2,
               local_4b0.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_670);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->ChargeOptimizationMethod).super_ParameterBase.empty_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_970,"SD",(allocator<char> *)&local_b30);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_190,&local_970);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_990,"CG",(allocator<char> *)&local_ab0);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_290,&local_990);
    OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_670,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_190,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_290);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9b0,"BFGS",(allocator<char> *)&local_af0);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_730,&local_9b0);
    OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_4b0,
                       (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        *)&local_670,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_730);
    std::__cxx11::string::string
              ((string *)&local_9d0,(string *)&(this->ChargeOptimizationMethod).data_);
    bVar3 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_4b0,&local_9d0);
    std::__cxx11::string::~string((string *)&local_9d0);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)&local_4b0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_730);
    std::__cxx11::string::~string((string *)&local_9b0);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_670);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_290);
    std::__cxx11::string::~string((string *)&local_990);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_190);
    std::__cxx11::string::~string((string *)&local_970);
    if (!bVar3) {
      pcVar2 = (this->ChargeOptimizationMethod).super_ParameterBase.keyword_._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9f0,"SD",(allocator<char> *)&local_ab0);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_190,&local_9f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a10,"CG",(allocator<char> *)&local_af0);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_290,&local_a10);
      OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_670,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_190,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_290);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a30,"BFGS",(allocator<char> *)&local_a70);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_730,&local_a30);
      OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_4b0,
                         (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                          *)&local_670,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_730);
      std::__cxx11::string::string((string *)&local_b30,(string *)&local_4b0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar2,
               local_b30.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_
               ._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_b30);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)&local_4b0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_730)
      ;
      std::__cxx11::string::~string((string *)&local_a30);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_670);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_290)
      ;
      std::__cxx11::string::~string((string *)&local_a10);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_190)
      ;
      std::__cxx11::string::~string((string *)&local_9f0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->MaxIterations).super_ParameterBase.empty_ == false) {
    isPositive();
    iVar1 = *(int *)&(this->MaxIterations).super_ParameterBase.field_0x2c;
    std::__cxx11::string::~string((string *)&local_4b0);
    if (iVar1 < 1) {
      pcVar2 = (this->MaxIterations).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&local_4b0,(string *)&local_670);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar2,
               local_4b0.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_670);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->TargetTemp).super_ParameterBase.empty_ == false) {
    isNonNegative();
    local_b50 = (this->TargetTemp).data_;
    std::__cxx11::string::~string((string *)&local_4b0);
    if (local_b50 < 0.0) {
      pcVar2 = (this->TargetTemp).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      std::__cxx11::string::string((string *)&local_4b0,(string *)&local_670);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar2,
               local_4b0.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_670);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->TauThermostat).super_ParameterBase.empty_ == false) {
    isPositive();
    local_b50 = (this->TauThermostat).data_;
    std::__cxx11::string::~string((string *)&local_4b0);
    if (local_b50 <= 0.0) {
      pcVar2 = (this->TauThermostat).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&local_4b0,(string *)&local_670);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar2,
               local_4b0.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_670);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->DragCoefficient).super_ParameterBase.empty_ == false) {
    isPositive();
    local_b50 = (this->DragCoefficient).data_;
    std::__cxx11::string::~string((string *)&local_4b0);
    if (local_b50 <= 0.0) {
      pcVar2 = (this->DragCoefficient).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&local_4b0,(string *)&local_670);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar2,
               local_4b0.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_670);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->InitialStepSize).super_ParameterBase.empty_ == false) {
    GreaterThanConstraint<double>::GreaterThanConstraint
              ((GreaterThanConstraint<double> *)&local_670,0.0);
    LessThanOrEqualToConstraint<double>::LessThanOrEqualToConstraint
              ((LessThanOrEqualToConstraint<double> *)&local_190,1.0);
    operator&&((AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
                *)&local_4b0,
               (ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_> *)&local_670,
               (ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_> *)&local_190);
    local_b50 = (this->InitialStepSize).data_;
    local_b38 = local_4b0.cons1_.cons1_.
                super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                .description_._M_dataplus._M_p;
    local_b40 = (double)local_4b0.cons1_.cons1_.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_string_length;
    AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
    ::~AndParamConstraint
              ((AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
                *)&local_4b0);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_670);
    if ((local_b50 <= (double)local_b38) || (local_b40 < local_b50)) {
      pcVar2 = (this->InitialStepSize).super_ParameterBase.keyword_._M_dataplus._M_p;
      GreaterThanConstraint<double>::GreaterThanConstraint
                ((GreaterThanConstraint<double> *)&local_670,0.0);
      LessThanOrEqualToConstraint<double>::LessThanOrEqualToConstraint
                ((LessThanOrEqualToConstraint<double> *)&local_190,1.0);
      operator&&((AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
                  *)&local_4b0,
                 (ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_> *)&local_670,
                 (ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_> *)&local_190);
      std::__cxx11::string::string((string *)&local_290,(string *)&local_4b0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar2,
               local_290.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_290);
      AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
      ::~AndParamConstraint
                ((AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
                  *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_670);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void FluctuatingChargeParameters::validate() {
    CheckParameter(Propagator,
                   isEqualIgnoreCase("Damped") || isEqualIgnoreCase("NVT") ||
                       isEqualIgnoreCase("Langevin") ||
                       isEqualIgnoreCase("Minimizer") ||
                       isEqualIgnoreCase("NVE") || isEqualIgnoreCase("Exact"));
    CheckParameter(Friction, isNonNegative());
    CheckParameter(Tolerance, isPositive());
    CheckParameter(ChargeOptimizationMethod, isEqualIgnoreCase("SD") ||
                                                 isEqualIgnoreCase("CG") ||
                                                 isEqualIgnoreCase("BFGS"));
    CheckParameter(MaxIterations, isPositive());
    CheckParameter(TargetTemp, isNonNegative());
    CheckParameter(TauThermostat, isPositive());
    CheckParameter(DragCoefficient, isPositive());
    RealType zero = 0.0;
    RealType one  = 1.0;
    CheckParameter(InitialStepSize,
                   isGreaterThan(zero) && isLessThanOrEqualTo(one));
  }